

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O2

void __thiscall chrono::ChLinkLock::BuildLinkType(ChLinkLock *this,LinkType link_type)

{
  bool z;
  bool y;
  bool x;
  bool e1;
  bool e2;
  bool e3;
  
  this->type = link_type;
  switch(link_type) {
  case LOCK:
    e3 = true;
    goto LAB_00ac39a3;
  case SPHERICAL:
    x = true;
    goto LAB_00ac3957;
  case POINTPLANE:
    z = true;
    x = false;
    y = false;
    break;
  case POINTLINE:
    x = false;
LAB_00ac3957:
    z = true;
    y = z;
    break;
  case CYLINDRICAL:
    e3 = false;
    goto LAB_00ac3977;
  case PRISMATIC:
    e3 = true;
LAB_00ac3977:
    e2 = true;
    y = true;
    z = false;
    e1 = y;
    x = y;
    goto LAB_00ac39bd;
  case PLANEPLANE:
    e3 = false;
    goto LAB_00ac39b3;
  case OLDHAM:
    e3 = true;
LAB_00ac39b3:
    x = false;
    y = false;
    goto LAB_00ac39b7;
  case REVOLUTE:
    e3 = false;
LAB_00ac39a3:
    x = true;
LAB_00ac39a5:
    y = true;
LAB_00ac39b7:
    z = true;
    e2 = true;
    e1 = z;
    goto LAB_00ac39bd;
  default:
    x = false;
    z = false;
    y = false;
    break;
  case ALIGN:
    e2 = true;
    e3 = e2;
    goto LAB_00ac3929;
  case PARALLEL:
    e3 = false;
    e2 = true;
    goto LAB_00ac3929;
  case PERPEND:
    e2 = false;
    e3 = true;
LAB_00ac3929:
    y = false;
    z = false;
    e1 = true;
    x = false;
    goto LAB_00ac39bd;
  case REVOLUTEPRISMATIC:
    e3 = false;
    x = false;
    goto LAB_00ac39a5;
  }
  e3 = false;
  e2 = false;
  e1 = false;
LAB_00ac39bd:
  BuildLink(this,x,y,z,false,e1,e2,e3);
  return;
}

Assistant:

void ChLinkLock::BuildLinkType(LinkType link_type) {
    type = link_type;

    // SetLockMask() sets the constraints for the link coordinates: (X,Y,Z, E0,E1,E2,E3)
    switch (type) {
        case LinkType::FREE:
            BuildLink(false, false, false, false, false, false, false);
            break;
        case LinkType::LOCK:
            // this should never happen
            BuildLink(true, true, true, false, true, true, true);
            break;
        case LinkType::SPHERICAL:
            BuildLink(true, true, true, false, false, false, false);
            break;
        case LinkType::POINTPLANE:
            BuildLink(false, false, true, false, false, false, false);
            break;
        case LinkType::POINTLINE:
            BuildLink(false, true, true, false, false, false, false);
            break;
        case LinkType::REVOLUTE:
            BuildLink(true, true, true, false, true, true, false);
            break;
        case LinkType::CYLINDRICAL:
            BuildLink(true, true, false, false, true, true, false);
            break;
        case LinkType::PRISMATIC:
            BuildLink(true, true, false, false, true, true, true);
            break;
        case LinkType::PLANEPLANE:
            BuildLink(false, false, true, false, true, true, false);
            break;
        case LinkType::OLDHAM:
            BuildLink(false, false, true, false, true, true, true);
            break;
        case LinkType::ALIGN:
            BuildLink(false, false, false, false, true, true, true);
            break;
        case LinkType::PARALLEL:
            BuildLink(false, false, false, false, true, true, false);
            break;
        case LinkType::PERPEND:
            BuildLink(false, false, false, false, true, false, true);
            break;
        case LinkType::REVOLUTEPRISMATIC:
            BuildLink(false, true, true, false, true, true, false);
            break;
        default:
            BuildLink(false, false, false, false, false, false, false);
            break;
    }
}